

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void menu_refresh(menu *menu,_Bool reset_screen)

{
  region *prVar1;
  region *loc;
  int oid;
  _Bool reset_screen_local;
  menu *menu_local;
  
  loc._0_4_ = menu->cursor;
  prVar1 = &menu->active;
  if (reset_screen) {
    screen_load();
    screen_save();
  }
  if ((menu->filter_list != (int *)0x0) && (-1 < menu->cursor)) {
    loc._0_4_ = menu->filter_list[(int)loc];
  }
  if (menu->title != (char *)0x0) {
    Term_putstr((menu->boundary).col,(menu->boundary).row,(menu->active).width,L'\x01',menu->title);
  }
  if (menu->header != (char *)0x0) {
    Term_putstr(prVar1->col,(menu->active).row + L'\xffffffff',(menu->active).width,L'\x01',
                menu->header);
  }
  if (menu->prompt != (char *)0x0) {
    Term_putstr((menu->boundary).col,(menu->active).row + (menu->active).page_rows,
                (menu->active).width,L'\x01',menu->prompt);
  }
  if ((menu->browse_hook != (_func_void_int_void_ptr_region_ptr *)0x0) && (-1 < (int)loc)) {
    (*menu->browse_hook)((int)loc,menu->menu_data,prVar1);
  }
  (*menu->skin->display_list)(menu,menu->cursor,&menu->top,prVar1);
  return;
}

Assistant:

void menu_refresh(struct menu *menu, bool reset_screen)
{
	int oid = menu->cursor;
	region *loc = &menu->active;

	if (reset_screen) {
		screen_load();
		screen_save();
	}

	if (menu->filter_list && menu->cursor >= 0)
		oid = menu->filter_list[oid];

	if (menu->title)
		Term_putstr(menu->boundary.col, menu->boundary.row,
				loc->width, COLOUR_WHITE, menu->title);

	if (menu->header)
		Term_putstr(loc->col, loc->row - 1, loc->width,
				COLOUR_WHITE, menu->header);

	if (menu->prompt)
		Term_putstr(menu->boundary.col, loc->row + loc->page_rows,
				loc->width, COLOUR_WHITE, menu->prompt);

	if (menu->browse_hook && oid >= 0)
		menu->browse_hook(oid, menu->menu_data, loc);

	menu->skin->display_list(menu, menu->cursor, &menu->top, loc);
}